

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

void __thiscall duckdb::VacuumInfo::Serialize(VacuumInfo *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"info_type");
  Serializer::WriteValue<duckdb::ParseInfoType>(serializer,(this->super_ParseInfo).info_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"options");
  Serializer::WriteValue<duckdb::VacuumOptions>
            (serializer,(VacuumOptions *)&(this->super_ParseInfo).field_0x9);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xc9,"has_table",&this->has_table);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (serializer,0xca,"ref",&this->ref);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xcb,"columns",&this->columns);
  return;
}

Assistant:

void VacuumInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WriteProperty<VacuumOptions>(200, "options", options);
	serializer.WritePropertyWithDefault<bool>(201, "has_table", has_table);
	serializer.WritePropertyWithDefault<unique_ptr<TableRef>>(202, "ref", ref);
	serializer.WritePropertyWithDefault<vector<string>>(203, "columns", columns);
}